

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryPushJavascriptArrayNoFastPath
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  int operationSucceeded;
  BOOL operationSucceeded_00;
  ThreadContext *threadContext;
  JavascriptArray *arr_00;
  undefined4 *puVar3;
  Var pvVar4;
  undefined1 local_80 [8];
  BigIndex big;
  undefined1 local_68 [4];
  uint index;
  ThrowTypeErrorOnFailureHelper h;
  uint n;
  undefined1 local_48 [8];
  JsReentLock jsReentLock;
  uint argCount_local;
  Var *args_local;
  JavascriptArray *arr_local;
  ScriptContext *scriptContext_local;
  
  jsReentLock._28_4_ = argCount;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_48,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_48,arr);
  h.m_functionName._0_4_ = (arr->super_ArrayObject).length;
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)local_68,scriptContext,L"Array.prototype.push");
  for (big.bigIndex._4_4_ = 0;
      big.bigIndex._4_4_ < (uint)jsReentLock._28_4_ && (Type)h.m_functionName != 0xffffffff;
      big.bigIndex._4_4_ = big.bigIndex._4_4_ + 1) {
    operationSucceeded =
         (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
           super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                   (arr,(ulong)(Type)h.m_functionName,args[big.bigIndex._4_4_],0);
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_68,operationSucceeded);
    h.m_functionName._0_4_ = (Type)h.m_functionName + 1;
  }
  if (big.bigIndex._4_4_ < (uint)jsReentLock._28_4_) {
    arr_00 = EnsureNonNativeArray(arr);
    if ((Type)h.m_functionName != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x154e,"(n == JavascriptArray::MaxArrayLength)",
                                  "n == JavascriptArray::MaxArrayLength");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    BigIndex::BigIndex((BigIndex *)local_80,(Type)h.m_functionName);
    while (big.bigIndex._4_4_ < (uint)jsReentLock._28_4_) {
      JsReentLock::unlock((JsReentLock *)local_48);
      operationSucceeded_00 =
           BigIndex::SetItem((BigIndex *)local_80,arr_00,args[big.bigIndex._4_4_]);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_68,operationSucceeded_00);
      JsReentLock::MutateArrayObject((JsReentLock *)local_48);
      JsReentLock::relock((JsReentLock *)local_48);
      big.bigIndex._4_4_ = big.bigIndex._4_4_ + 1;
      BigIndex::operator++((BigIndex *)local_80);
    }
    (*(arr_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
  }
  (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  pvVar4 = JavascriptNumber::ToVar((Type)h.m_functionName,scriptContext);
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return pvVar4;
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArrayNoFastPath(ScriptContext * scriptContext, JavascriptArray* arr, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // First handle "small" indices.
        uint index;
        for (index = 0; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[index], PropertyOperation_None));
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            // Not supporting native array with BigIndex.
            arr = EnsureNonNativeArray(arr);
            Assert(n == JavascriptArray::MaxArrayLength);
            for (BigIndex big = n; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(big.SetItem(arr, args[index])));
            }

#ifdef VALIDATE_ARRAY
            arr->ValidateArray();
#endif
            // This is where we should set the length, but for arrays it cannot be >= MaxArrayLength
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
        }

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif
        return JavascriptNumber::ToVar(n, scriptContext);
    }